

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_formatimpl.cpp
# Opt level: O3

int32_t icu_63::number::impl::NumberFormatterImpl::writeAffixes
                  (MicroProps *micros,NumberStringBuilder *string,int32_t start,int32_t end,
                  UErrorCode *status)

{
  Modifier *mod1;
  int iVar1;
  int32_t iVar2;
  int iVar3;
  int iVar4;
  
  iVar1 = (*micros->modInner->_vptr_Modifier[2])();
  mod1 = micros->modMiddle;
  if ((micros->padding).fWidth < 1) {
    iVar3 = (*mod1->_vptr_Modifier[2])
                      (mod1,string,(ulong)(uint)start,(ulong)(uint)(end + iVar1),status);
    iVar4 = (*micros->modOuter->_vptr_Modifier[2])
                      (micros->modOuter,string,(ulong)(uint)start,(ulong)(uint)(end + iVar3 + iVar1)
                       ,status);
    iVar1 = iVar4 + iVar3 + iVar1;
  }
  else {
    iVar2 = Padder::padAndApply(&micros->padding,mod1,micros->modOuter,string,start,end + iVar1,
                                status);
    iVar1 = iVar2 + iVar1;
  }
  return iVar1;
}

Assistant:

int32_t NumberFormatterImpl::writeAffixes(const MicroProps& micros, NumberStringBuilder& string,
                                          int32_t start, int32_t end, UErrorCode& status) {
    // Always apply the inner modifier (which is "strong").
    int32_t length = micros.modInner->apply(string, start, end, status);
    if (micros.padding.isValid()) {
        length += micros.padding
                .padAndApply(*micros.modMiddle, *micros.modOuter, string, start, length + end, status);
    } else {
        length += micros.modMiddle->apply(string, start, length + end, status);
        length += micros.modOuter->apply(string, start, length + end, status);
    }
    return length;
}